

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val *
duckdb_yyjson::yyjson_mut_patch
          (yyjson_mut_doc *doc,yyjson_mut_val *orig,yyjson_mut_val *patch,yyjson_patch_err *err)

{
  size_t sVar1;
  char **ppcVar2;
  ulong uVar3;
  undefined8 *puVar4;
  bool bVar5;
  patch_op pVar6;
  yyjson_ptr_code yVar7;
  yyjson_mut_val *lhs;
  yyjson_mut_val *pyVar8;
  char *pcVar9;
  ulong *puVar10;
  size_t ptr_len;
  ulong uVar11;
  size_t sVar12;
  ulong *puVar13;
  yyjson_ptr_err *err_00;
  ulong *puVar14;
  yyjson_mut_val *val;
  ulong *puVar15;
  ulong uVar16;
  yyjson_mut_val *local_b8;
  char *local_a8;
  char *local_98;
  char *local_88;
  yyjson_patch_err err_tmp;
  
  if (err == (yyjson_patch_err *)0x0) {
    err = &err_tmp;
    err_00 = &err_tmp.ptr;
  }
  else {
    err_00 = &err->ptr;
  }
  (err->ptr).msg = (char *)0x0;
  (err->ptr).pos = 0;
  err->msg = (char *)0x0;
  *(undefined8 *)&err->ptr = 0;
  *(undefined8 *)err = 0;
  err->idx = 0;
  if (((doc == (yyjson_mut_doc *)0x0) || (orig == (yyjson_mut_val *)0x0)) ||
     (patch == (yyjson_mut_val *)0x0)) {
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar9 = "input parameter is NULL";
LAB_0188d170:
      err->msg = pcVar9;
LAB_0188d174:
      err->idx = 0;
      return (yyjson_mut_val *)0x0;
    }
    err->code = 2;
    pcVar9 = "input parameter is NULL";
  }
  else {
    if ((patch->tag & 7) == 6) {
      local_b8 = unsafe_yyjson_mut_val_mut_copy(doc,orig);
      if (local_b8 != (yyjson_mut_val *)0x0) {
        uVar3 = patch->tag;
        if (uVar3 < 0x100 || ((uint)uVar3 & 7) != 6) {
          return local_b8;
        }
        puVar15 = (ulong *)(patch->uni).u64;
        ppcVar2 = &err_00->msg;
        sVar12 = 0;
LAB_0188ca1a:
        puVar15 = (ulong *)puVar15[2];
        if (puVar15 == (ulong *)0x0) {
          return local_b8;
        }
        uVar16 = *puVar15;
        if ((~(uint)uVar16 & 7) != 0) {
          if ((err->ptr).code != 6) {
            err->code = 3;
            pcVar9 = "JSON patch operation is not object";
            goto LAB_0188d037;
          }
          err->code = 2;
          err->msg = "JSON patch operation is not object";
          goto LAB_0188d0c5;
        }
        if (uVar16 < 0x100) {
LAB_0188d015:
          if ((err->ptr).code != 6) {
            err->code = 4;
            pcVar9 = "missing key `op`";
LAB_0188d037:
            err->msg = pcVar9;
            err->idx = sVar12;
            return (yyjson_mut_val *)0x0;
          }
          err->code = 2;
          pcVar9 = "missing key `op`";
LAB_0188d054:
          err->msg = pcVar9;
LAB_0188d05b:
          *(undefined8 *)err_00 = 0;
          err_00->msg = (char *)0x0;
          err_00->pos = 0;
          return (yyjson_mut_val *)0x0;
        }
        sVar1 = sVar12 + 1;
        uVar16 = uVar16 >> 8;
        puVar14 = (ulong *)puVar15[1];
        puVar10 = puVar14;
        uVar11 = uVar16;
        while ((puVar10 = *(ulong **)(puVar10[2] + 0x10), (*puVar10 & 0xffffffffffffff00) != 0x200
               || (*(short *)puVar10[1] != 0x706f))) {
          uVar11 = uVar11 - 1;
          if (uVar11 == 0) goto LAB_0188d015;
        }
        puVar4 = (undefined8 *)puVar10[2];
        if (puVar4 == (undefined8 *)0x0) goto LAB_0188d015;
        local_98 = "cannot set root";
        local_88 = "input parameter is NULL";
        local_a8 = "no prefix \'/\'";
        if (((uint)(duckdb_yyjson *)*puVar4 & 7) != 5) {
          if ((err->ptr).code != 6) {
            err->code = 5;
            pcVar9 = "invalid member `op`";
            goto LAB_0188d037;
          }
          err->code = 2;
          pcVar9 = "invalid member `op`";
          goto LAB_0188d054;
        }
        pVar6 = patch_op_get((duckdb_yyjson *)*puVar4,(yyjson_val *)puVar4[1]);
        uVar11 = uVar16;
        puVar10 = puVar14;
        while ((puVar10 = *(ulong **)(puVar10[2] + 0x10), (*puVar10 & 0xffffffffffffff00) != 0x400
               || (*(int *)puVar10[1] != 0x68746170))) {
          uVar11 = uVar11 - 1;
          if (uVar11 == 0) goto LAB_0188d041;
        }
        puVar10 = (ulong *)puVar10[2];
        if (puVar10 == (ulong *)0x0) {
LAB_0188d041:
          if ((err->ptr).code != 6) {
            err->code = 4;
            pcVar9 = "missing key `path`";
            goto LAB_0188d07a;
          }
          err->code = 2;
          pcVar9 = "missing key `path`";
          goto LAB_0188d054;
        }
        uVar11 = *puVar10;
        if (((uint)uVar11 & 7) != 5) {
          if ((err->ptr).code == 6) {
            err->code = 2;
            err->msg = "invalid member `path`";
            goto LAB_0188d05b;
          }
          err->code = 5;
          pcVar9 = "invalid member `path`";
          goto LAB_0188d41d;
        }
        if (pVar6 < PATCH_OP_NONE) {
          if ((0x25U >> (pVar6 & 0x1f) & 1) == 0) {
            puVar13 = (ulong *)0x0;
            lhs = (yyjson_mut_val *)0x0;
            ptr_len = 0;
            if ((0x18U >> (pVar6 & 0x1f) & 1) != 0) {
              while ((puVar14 = *(ulong **)(puVar14[2] + 0x10),
                     (*puVar14 & 0xffffffffffffff00) != 0x400 || (*(int *)puVar14[1] != 0x6d6f7266))
                    ) {
                uVar16 = uVar16 - 1;
                if (uVar16 == 0) goto LAB_0188d0d5;
              }
              puVar13 = (ulong *)puVar14[2];
              if (puVar13 == (ulong *)0x0) {
LAB_0188d0d5:
                if ((err->ptr).code != 6) {
                  err->code = 4;
                  pcVar9 = "missing key `from`";
                  goto LAB_0188d07a;
                }
                err->code = 2;
                pcVar9 = "missing key `from`";
              }
              else {
                if (((uint)*puVar13 & 7) == 5) {
                  ptr_len = *puVar13 >> 8;
                  lhs = (yyjson_mut_val *)0x0;
                  goto LAB_0188cc45;
                }
                if ((err->ptr).code != 6) {
                  err->code = 5;
                  pcVar9 = "invalid member `from`";
                  goto LAB_0188d41d;
                }
                err->code = 2;
                pcVar9 = "invalid member `from`";
              }
              goto LAB_0188d054;
            }
            goto LAB_0188cc45;
          }
          while ((puVar14 = *(ulong **)(puVar14[2] + 0x10), (*puVar14 & 0xffffffffffffff00) != 0x500
                 || ((char)((int *)puVar14[1])[1] != 'e' || *(int *)puVar14[1] != 0x756c6176))) {
            uVar16 = uVar16 - 1;
            if (uVar16 == 0) goto LAB_0188d096;
          }
          if ((yyjson_mut_val *)puVar14[2] == (yyjson_mut_val *)0x0) {
LAB_0188d096:
            if ((err->ptr).code != 6) {
              err->code = 4;
              pcVar9 = "missing key `value`";
              goto LAB_0188d07a;
            }
            err->code = 2;
            pcVar9 = "missing key `value`";
            goto LAB_0188d054;
          }
          lhs = unsafe_yyjson_mut_val_mut_copy(doc,(yyjson_mut_val *)puVar14[2]);
          if (lhs != (yyjson_mut_val *)0x0) {
            puVar13 = (ulong *)0x0;
            ptr_len = 0;
            goto LAB_0188cc45;
          }
LAB_0188d487:
          yVar7 = (err->ptr).code;
          err->code = 2;
          err->msg = "failed to copy value";
          if (yVar7 == 6) goto LAB_0188d05b;
          goto LAB_0188d421;
        }
        puVar13 = (ulong *)0x0;
        lhs = (yyjson_mut_val *)0x0;
        ptr_len = 0;
LAB_0188cc45:
        if (PATCH_OP_TEST < pVar6) {
          if ((err->ptr).code != 6) {
            err->code = 5;
            pcVar9 = "unsupported `op`";
LAB_0188d07a:
            err->msg = pcVar9;
            err->idx = sVar12;
            return (yyjson_mut_val *)0x0;
          }
          err->code = 2;
          pcVar9 = "unsupported `op`";
          goto LAB_0188d054;
        }
        uVar16 = uVar11 >> 8;
        switch(pVar6) {
        case PATCH_OP_ADD:
          if (0xff < uVar11) {
            pcVar9 = (char *)puVar10[1];
            (err->ptr).code = 0;
            *ppcVar2 = (char *)0x0;
            err_00->pos = 0;
            yVar7 = 1;
            if (((lhs == (yyjson_mut_val *)0x0) || (local_b8 == (yyjson_mut_val *)0x0)) ||
               (pcVar9 == (char *)0x0)) {
              local_a8 = "input parameter is NULL";
LAB_0188d322:
              (err->ptr).code = yVar7;
              local_88 = local_a8;
LAB_0188d32f:
              err_00->msg = local_88;
              err_00->pos = 0;
            }
            else {
              if (*pcVar9 != '/') {
                yVar7 = 2;
                goto LAB_0188d322;
              }
LAB_0188ceca:
              bVar5 = unsafe_yyjson_mut_ptr_putx
                                (local_b8,pcVar9,uVar16,lhs,doc,false,true,(yyjson_ptr_ctx *)0x0,
                                 err_00);
              lhs = local_b8;
              if (bVar5) goto LAB_0188cfcb;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar9 = "failed to add `path`";
                goto LAB_0188d054;
              }
            }
            err->code = 7;
            pcVar9 = "failed to add `path`";
            break;
          }
LAB_0188cfcb:
          local_b8 = lhs;
          sVar12 = sVar1;
          if (sVar1 == uVar3 >> 8) {
            return local_b8;
          }
          goto LAB_0188ca1a;
        case PATCH_OP_REMOVE:
          pcVar9 = (char *)puVar10[1];
          (err->ptr).code = 0;
          *ppcVar2 = (char *)0x0;
          err_00->pos = 0;
          yVar7 = 1;
          if ((local_b8 == (yyjson_mut_val *)0x0) || (pcVar9 == (char *)0x0)) {
            local_98 = "input parameter is NULL";
LAB_0188d2f2:
            (err->ptr).code = yVar7;
            err_00->msg = local_98;
            err_00->pos = 0;
          }
          else {
            if (uVar11 < 0x100) {
              yVar7 = 5;
              goto LAB_0188d2f2;
            }
            if (*pcVar9 != '/') {
              yVar7 = 2;
              local_98 = "no prefix \'/\'";
              goto LAB_0188d2f2;
            }
            pyVar8 = unsafe_yyjson_mut_ptr_removex
                               (local_b8,pcVar9,uVar16,(yyjson_ptr_ctx *)0x0,err_00);
            lhs = local_b8;
            if (pyVar8 != (yyjson_mut_val *)0x0) goto LAB_0188cfcb;
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar9 = "failed to remove `path`";
              goto LAB_0188d054;
            }
          }
          err->code = 7;
          pcVar9 = "failed to remove `path`";
          break;
        case PATCH_OP_REPLACE:
          if (uVar11 < 0x100) goto LAB_0188cfcb;
          pcVar9 = (char *)puVar10[1];
          (err->ptr).code = 0;
          *ppcVar2 = (char *)0x0;
          err_00->pos = 0;
          yVar7 = 1;
          if (((lhs == (yyjson_mut_val *)0x0) || (local_b8 == (yyjson_mut_val *)0x0)) ||
             (pcVar9 == (char *)0x0)) {
            local_a8 = "input parameter is NULL";
LAB_0188d2b6:
            (err->ptr).code = yVar7;
            err_00->msg = local_a8;
            err_00->pos = 0;
          }
          else {
            if (*pcVar9 != '/') {
              yVar7 = 2;
              goto LAB_0188d2b6;
            }
            pyVar8 = unsafe_yyjson_mut_ptr_replacex
                               (local_b8,pcVar9,uVar16,lhs,(yyjson_ptr_ctx *)0x0,err_00);
            lhs = local_b8;
            if (pyVar8 != (yyjson_mut_val *)0x0) goto LAB_0188cfcb;
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar9 = "failed to replace `path`";
              goto LAB_0188d054;
            }
          }
          err->code = 7;
          pcVar9 = "failed to replace `path`";
          break;
        case PATCH_OP_MOVE:
          lhs = local_b8;
          if (ptr_len == 0 && uVar16 == 0) goto LAB_0188cfcb;
          pcVar9 = (char *)puVar13[1];
          (err->ptr).code = 0;
          *ppcVar2 = (char *)0x0;
          err_00->pos = 0;
          yVar7 = 1;
          if ((local_b8 == (yyjson_mut_val *)0x0) || (pcVar9 == (char *)0x0)) {
            local_98 = "input parameter is NULL";
LAB_0188d3d8:
            (err->ptr).code = yVar7;
            err_00->msg = local_98;
            err_00->pos = 0;
          }
          else {
            if (ptr_len == 0) {
              yVar7 = 5;
              goto LAB_0188d3d8;
            }
            if (*pcVar9 != '/') {
              yVar7 = 2;
              local_98 = "no prefix \'/\'";
              goto LAB_0188d3d8;
            }
            lhs = unsafe_yyjson_mut_ptr_removex
                            (local_b8,pcVar9,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
            if (lhs != (yyjson_mut_val *)0x0) {
              if (uVar11 < 0x100) goto LAB_0188cfcb;
              pcVar9 = (char *)puVar10[1];
              (err->ptr).code = 0;
              *ppcVar2 = (char *)0x0;
              err_00->pos = 0;
              if (pcVar9 == (char *)0x0) goto LAB_0188d203;
LAB_0188ceba:
              if (*pcVar9 != '/') {
                yVar7 = 2;
                local_88 = "no prefix \'/\'";
                goto LAB_0188d21b;
              }
              goto LAB_0188ceca;
            }
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar9 = "failed to remove `from`";
              goto LAB_0188d054;
            }
          }
          err->code = 7;
          pcVar9 = "failed to remove `from`";
          break;
        case PATCH_OP_COPY:
          pcVar9 = (char *)puVar13[1];
          (err->ptr).code = 0;
          *ppcVar2 = (char *)0x0;
          err_00->pos = 0;
          yVar7 = 1;
          if ((local_b8 == (yyjson_mut_val *)0x0) || (pcVar9 == (char *)0x0)) {
            local_a8 = "input parameter is NULL";
LAB_0188d39e:
            (err->ptr).code = yVar7;
            err_00->msg = local_a8;
            err_00->pos = 0;
          }
          else {
            lhs = local_b8;
            if (ptr_len == 0) {
LAB_0188cd43:
              if (uVar11 < 0x100) goto LAB_0188cfcb;
              lhs = unsafe_yyjson_mut_val_mut_copy(doc,lhs);
              if (lhs == (yyjson_mut_val *)0x0) goto LAB_0188d487;
              pcVar9 = (char *)puVar10[1];
              (err->ptr).code = 0;
              *ppcVar2 = (char *)0x0;
              err_00->pos = 0;
              if (pcVar9 != (char *)0x0) goto LAB_0188ceba;
LAB_0188d203:
              yVar7 = 1;
LAB_0188d21b:
              (err->ptr).code = yVar7;
              goto LAB_0188d32f;
            }
            if (*pcVar9 != '/') {
              yVar7 = 2;
              goto LAB_0188d39e;
            }
            lhs = unsafe_yyjson_mut_ptr_getx(local_b8,pcVar9,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
            if (lhs != (yyjson_mut_val *)0x0) goto LAB_0188cd43;
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar9 = "failed to get `from`";
              goto LAB_0188d054;
            }
          }
          err->code = 7;
          pcVar9 = "failed to get `from`";
          break;
        case PATCH_OP_TEST:
          pcVar9 = (char *)puVar10[1];
          (err->ptr).code = 0;
          *ppcVar2 = (char *)0x0;
          err_00->pos = 0;
          yVar7 = 1;
          if ((local_b8 == (yyjson_mut_val *)0x0) || (pcVar9 == (char *)0x0)) {
            local_a8 = "input parameter is NULL";
LAB_0188d352:
            (err->ptr).code = yVar7;
            err_00->msg = local_a8;
            err_00->pos = 0;
          }
          else {
            pyVar8 = local_b8;
            if (uVar11 < 0x100) {
LAB_0188cfad:
              if ((lhs == (yyjson_mut_val *)0x0) ||
                 (bVar5 = unsafe_yyjson_mut_equals(lhs,pyVar8), lhs = local_b8, !bVar5)) {
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar9 = "failed to test equal";
                  goto LAB_0188d054;
                }
                err->code = 6;
                pcVar9 = "failed to test equal";
                break;
              }
              goto LAB_0188cfcb;
            }
            if (*pcVar9 != '/') {
              yVar7 = 2;
              goto LAB_0188d352;
            }
            pyVar8 = unsafe_yyjson_mut_ptr_getx(local_b8,pcVar9,uVar16,(yyjson_ptr_ctx *)0x0,err_00)
            ;
            if (pyVar8 != (yyjson_mut_val *)0x0) goto LAB_0188cfad;
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar9 = "failed to get `path`";
              goto LAB_0188d054;
            }
          }
          err->code = 7;
          pcVar9 = "failed to get `path`";
        }
LAB_0188d41d:
        err->msg = pcVar9;
LAB_0188d421:
        err->idx = sVar12;
        return (yyjson_mut_val *)0x0;
      }
      yVar7 = (err->ptr).code;
      err->code = 2;
      err->msg = "failed to copy value";
      if (yVar7 != 6) goto LAB_0188d174;
      goto LAB_0188d0c5;
    }
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar9 = "input patch is not array";
      goto LAB_0188d170;
    }
    err->code = 2;
    pcVar9 = "input patch is not array";
  }
  err->msg = pcVar9;
LAB_0188d0c5:
  *(undefined8 *)err_00 = 0;
  err_00->msg = (char *)0x0;
  err_00->pos = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_mut_patch(yyjson_mut_doc *doc,
                                 yyjson_mut_val *orig,
                                 yyjson_mut_val *patch,
                                 yyjson_patch_err *err) {
    yyjson_mut_val *root, *obj;
    yyjson_mut_arr_iter iter;
    yyjson_patch_err err_tmp;
    if (!err) err = &err_tmp;
    memset(err, 0, sizeof(*err));
    memset(&iter, 0, sizeof(iter));

    if (unlikely(!doc || !orig || !patch)) {
        return_err(INVALID_PARAMETER, "input parameter is NULL");
    }
    if (unlikely(!yyjson_mut_is_arr(patch))) {
        return_err(INVALID_PARAMETER, "input patch is not array");
    }
    root = yyjson_mut_val_mut_copy(doc, orig);
    if (unlikely(!root)) return_err_copy();

    /* iterate through the patch array */
    yyjson_mut_arr_iter_init(patch, &iter);
    while ((obj = yyjson_mut_arr_iter_next(&iter))) {
        patch_op op_enum;
        yyjson_mut_val *op, *path, *from = NULL, *value;
        yyjson_mut_val *val = NULL, *test;
        usize path_len, from_len = 0;
        if (!unsafe_yyjson_is_obj(obj)) {
            return_err(INVALID_OPERATION, "JSON patch operation is not object");
        }

        /* get required member: op */
        op = yyjson_mut_obj_get(obj, "op");
        if (unlikely(!op)) return_err_key("`op`");
        if (unlikely(!yyjson_mut_is_str(op))) return_err_val("`op`");
        op_enum = patch_op_get((yyjson_val *)(void *)op);

        /* get required member: path */
        path = yyjson_mut_obj_get(obj, "path");
        if (unlikely(!path)) return_err_key("`path`");
        if (unlikely(!yyjson_mut_is_str(path))) return_err_val("`path`");
        path_len = unsafe_yyjson_get_len(path);

        /* get required member: value, from */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: case PATCH_OP_REPLACE: case PATCH_OP_TEST:
                value = yyjson_mut_obj_get(obj, "value");
                if (unlikely(!value)) return_err_key("`value`");
                val = yyjson_mut_val_mut_copy(doc, value);
                if (unlikely(!val)) return_err_copy();
                break;
            case PATCH_OP_MOVE: case PATCH_OP_COPY:
                from = yyjson_mut_obj_get(obj, "from");
                if (unlikely(!from)) return_err_key("`from`");
                if (unlikely(!yyjson_mut_is_str(from))) {
                    return_err_val("`from`");
                }
                from_len = unsafe_yyjson_get_len(from);
                break;
            default:
                break;
        }

        /* perform an operation */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: /* add(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_REMOVE: /* remove(path) */
                if (unlikely(!ptr_remove(path))) {
                    return_err(POINTER, "failed to remove `path`");
                }
                break;
            case PATCH_OP_REPLACE: /* replace(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_replace(path, val))) {
                    return_err(POINTER, "failed to replace `path`");
                }
                break;
            case PATCH_OP_MOVE: /* val = remove(from), add(path, val) */
                if (unlikely(from_len == 0 && path_len == 0)) break;
                val = ptr_remove(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to remove `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_COPY: /* val = get(from).copy, add(path, val) */
                val = ptr_get(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to get `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                val = yyjson_mut_val_mut_copy(doc, val);
                if (unlikely(!val)) return_err_copy();
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_TEST: /* test = get(path), test.eq(val) */
                test = ptr_get(path);
                if (unlikely(!test)) {
                    return_err(POINTER, "failed to get `path`");
                }
                if (unlikely(!yyjson_mut_equals(val, test))) {
                    return_err(EQUAL, "failed to test equal");
                }
                break;
            default:
                return_err(INVALID_MEMBER, "unsupported `op`");
        }
    }
    return root;
}